

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct64x64_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int iVar1;
  int in_ECX;
  uint in_EDX;
  long in_RDI;
  int in_R8D;
  __m128i *palVar2;
  __m128i *out1;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qa_01;
  longlong extraout_XMM0_Qa_02;
  longlong extraout_XMM0_Qa_03;
  longlong extraout_XMM0_Qa_04;
  longlong extraout_XMM0_Qa_05;
  longlong extraout_XMM0_Qa_06;
  longlong extraout_XMM0_Qa_07;
  longlong extraout_XMM0_Qa_08;
  longlong extraout_XMM0_Qa_09;
  longlong extraout_XMM0_Qa_10;
  longlong extraout_XMM0_Qa_11;
  longlong extraout_XMM0_Qa_12;
  longlong extraout_XMM0_Qa_13;
  longlong extraout_XMM0_Qa_14;
  longlong extraout_XMM0_Qa_15;
  longlong extraout_XMM0_Qa_16;
  longlong extraout_XMM0_Qa_17;
  longlong extraout_XMM0_Qa_18;
  longlong extraout_XMM0_Qa_19;
  longlong extraout_XMM0_Qa_20;
  longlong extraout_XMM0_Qa_21;
  longlong extraout_XMM0_Qa_22;
  longlong extraout_XMM0_Qa_23;
  longlong extraout_XMM0_Qa_24;
  __m128i *extraout_XMM0_Qa_25;
  __m128i *extraout_XMM0_Qa_26;
  longlong extraout_XMM0_Qa_27;
  longlong extraout_XMM0_Qa_28;
  __m128i *extraout_XMM0_Qa_29;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  longlong extraout_XMM0_Qb_01;
  longlong extraout_XMM0_Qb_02;
  longlong extraout_XMM0_Qb_03;
  longlong extraout_XMM0_Qb_04;
  longlong extraout_XMM0_Qb_05;
  longlong extraout_XMM0_Qb_06;
  longlong extraout_XMM0_Qb_07;
  longlong extraout_XMM0_Qb_08;
  longlong extraout_XMM0_Qb_09;
  longlong extraout_XMM0_Qb_10;
  longlong extraout_XMM0_Qb_11;
  longlong extraout_XMM0_Qb_12;
  longlong extraout_XMM0_Qb_13;
  longlong extraout_XMM0_Qb_14;
  longlong extraout_XMM0_Qb_15;
  longlong extraout_XMM0_Qb_16;
  longlong extraout_XMM0_Qb_17;
  longlong extraout_XMM0_Qb_18;
  longlong extraout_XMM0_Qb_19;
  longlong extraout_XMM0_Qb_20;
  longlong extraout_XMM0_Qb_21;
  longlong extraout_XMM0_Qb_22;
  longlong extraout_XMM0_Qb_23;
  longlong extraout_XMM0_Qb_24;
  __m128i *extraout_XMM0_Qb_25;
  __m128i *extraout_XMM0_Qb_26;
  longlong extraout_XMM0_Qb_27;
  longlong extraout_XMM0_Qb_28;
  __m128i *extraout_XMM0_Qb_29;
  __m128i *extraout_XMM0_Qb_30;
  __m128i in1;
  __m128i in1_00;
  __m128i in0;
  __m128i in0_00;
  __m128i temp2;
  __m128i temp1;
  __m128i u [64];
  __m128i cospi62;
  __m128i cospim58;
  __m128i cospim61;
  __m128i cospi59;
  __m128i cospi5;
  __m128i cospi7;
  __m128i cospim57;
  __m128i cospi63;
  __m128i cospim56;
  __m128i cospim52;
  __m128i cospim48;
  __m128i cospim40;
  __m128i cospim36;
  __m128i cospim32;
  __m128i cospim28;
  __m128i cospim24;
  __m128i cospim20;
  __m128i cospim16;
  __m128i cospim12;
  __m128i cospim8;
  __m128i cospim4;
  __m128i cospi60;
  __m128i cospi56;
  __m128i cospi48;
  __m128i cospi44;
  __m128i cospi40;
  __m128i cospi32;
  __m128i cospi28;
  __m128i cospi24;
  __m128i cospi20;
  __m128i cospi16;
  __m128i cospi12;
  __m128i cospi8;
  __m128i cospi6;
  __m128i cospi4;
  __m128i cospi3;
  __m128i cospi2;
  __m128i cospi1;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  int32_t *cospi;
  int j;
  int i;
  __m128i *in_stack_fffffffffffff2f8;
  __m128i *in_stack_fffffffffffff300;
  int local_cdc;
  longlong lVar3;
  __m128i *clamp_lo_00;
  __m128i *cospim16_00;
  __m128i *cospi16_00;
  longlong lVar4;
  __m128i *cospi32_00;
  __m128i *cospi48_00;
  __m128i *cospim32_00;
  __m128i *u_00;
  __m128i *cospim32_01;
  __m128i *cospim48_00;
  __m128i *clamp_lo_01;
  int bit_00;
  __m128i *clamp_hi_00;
  longlong local_c38;
  longlong lStack_c30;
  longlong local_c28;
  longlong lStack_c20;
  longlong local_c18;
  longlong lStack_c10;
  longlong local_c08;
  longlong lStack_c00;
  longlong local_bf8;
  longlong lStack_bf0;
  longlong local_be8;
  longlong lStack_be0;
  longlong local_bd8;
  longlong lStack_bd0;
  longlong local_bc8;
  longlong lStack_bc0;
  longlong local_bb8;
  longlong lStack_bb0;
  longlong local_ba8;
  longlong lStack_ba0;
  longlong local_b98;
  longlong lStack_b90;
  longlong local_b88;
  longlong lStack_b80;
  longlong local_b78;
  longlong lStack_b70;
  longlong local_b68;
  longlong lStack_b60;
  longlong local_b58;
  longlong lStack_b50;
  longlong local_b48;
  longlong lStack_b40;
  longlong local_b38;
  longlong lStack_b30;
  longlong local_b28;
  longlong lStack_b20;
  longlong local_b18;
  longlong lStack_b10;
  longlong local_b08;
  longlong lStack_b00;
  longlong local_af8;
  longlong lStack_af0;
  longlong local_ae8;
  longlong lStack_ae0;
  longlong local_ad8;
  longlong lStack_ad0;
  longlong local_ac8;
  longlong lStack_ac0;
  longlong local_ab8;
  longlong lStack_ab0;
  longlong local_aa8;
  longlong lStack_aa0;
  longlong local_a98;
  longlong lStack_a90;
  longlong local_a88;
  longlong lStack_a80;
  longlong local_a78;
  longlong lStack_a70;
  longlong local_a68;
  longlong lStack_a60;
  longlong local_a58;
  longlong lStack_a50;
  longlong local_a48;
  longlong lStack_a40;
  longlong local_a38;
  longlong lStack_a30;
  longlong local_a28;
  longlong lStack_a20;
  longlong local_a18;
  longlong lStack_a10;
  longlong local_a08;
  longlong lStack_a00;
  longlong local_9f8;
  longlong lStack_9f0;
  longlong local_9e8;
  longlong lStack_9e0;
  longlong local_9d8;
  longlong lStack_9d0;
  longlong local_9c8;
  longlong lStack_9c0;
  longlong local_9b8;
  longlong lStack_9b0;
  longlong local_9a8;
  longlong lStack_9a0;
  longlong local_998;
  longlong lStack_990;
  longlong local_988;
  longlong lStack_980;
  longlong local_978;
  longlong lStack_970;
  longlong local_968;
  longlong lStack_960;
  longlong local_958;
  longlong lStack_950;
  longlong local_948;
  longlong lStack_940;
  longlong local_938;
  longlong lStack_930;
  longlong local_928;
  longlong lStack_920;
  longlong local_918;
  longlong lStack_910;
  longlong local_908;
  longlong lStack_900;
  longlong local_8f8;
  longlong lStack_8f0;
  longlong local_8e8;
  longlong lStack_8e0;
  longlong local_8d8;
  longlong lStack_8d0;
  longlong local_8c8;
  longlong lStack_8c0;
  longlong local_8b8;
  longlong lStack_8b0;
  longlong local_8a8;
  longlong lStack_8a0;
  longlong local_898;
  longlong lStack_890;
  longlong local_888;
  longlong lStack_880;
  longlong local_878;
  longlong lStack_870;
  longlong local_868;
  longlong lStack_860;
  longlong local_858;
  longlong lStack_850;
  longlong local_848;
  longlong lStack_840;
  longlong local_838;
  longlong lStack_830;
  longlong local_828;
  longlong lStack_820;
  longlong local_818;
  longlong lStack_810;
  longlong local_808;
  longlong lStack_800;
  longlong local_7f8;
  longlong lStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  longlong local_7d8;
  longlong lStack_7d0;
  longlong local_7c8;
  longlong lStack_7c0;
  longlong local_7b8;
  longlong lStack_7b0;
  longlong local_7a8;
  longlong lStack_7a0;
  longlong local_798;
  longlong lStack_790;
  longlong local_788;
  longlong lStack_780;
  longlong local_778;
  longlong lStack_770;
  longlong local_768;
  longlong lStack_760;
  longlong local_758;
  longlong lStack_750;
  longlong local_748;
  longlong lStack_740;
  longlong local_738;
  longlong lStack_730;
  longlong local_728;
  longlong lStack_720;
  longlong local_718;
  longlong lStack_710;
  longlong local_708;
  longlong lStack_700;
  longlong local_6f8;
  longlong lStack_6f0;
  longlong local_6e8;
  longlong lStack_6e0;
  longlong local_6d8;
  longlong lStack_6d0;
  longlong local_6c8;
  longlong lStack_6c0;
  longlong local_6b8;
  longlong lStack_6b0;
  longlong local_6a8;
  longlong lStack_6a0;
  longlong local_698;
  longlong lStack_690;
  longlong local_688;
  longlong lStack_680;
  longlong local_678;
  longlong lStack_670;
  longlong local_668;
  longlong lStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  int local_62c;
  longlong local_628;
  longlong lStack_620;
  int32_t *local_610;
  uint local_608;
  uint local_604;
  int local_5fc;
  int local_5f8;
  uint local_5f4;
  long local_5e8;
  int32_t local_5dc;
  int local_5d8;
  int local_5d4;
  int32_t local_5d0;
  int32_t local_5cc;
  int32_t local_5c8;
  int local_5c4;
  int32_t local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  int32_t local_588;
  int32_t local_584;
  int32_t local_580;
  int32_t local_57c;
  int32_t local_578;
  int32_t local_574;
  int32_t local_570;
  int32_t local_56c;
  int32_t local_568;
  int32_t local_564;
  int32_t local_560;
  int32_t local_55c;
  int32_t local_558;
  int32_t local_554;
  int32_t local_550;
  int32_t local_54c;
  int32_t local_548;
  int local_544;
  int local_540;
  int local_53c;
  longlong local_538;
  longlong lStack_530;
  int local_528;
  int local_524;
  int local_520;
  int local_51c;
  undefined8 local_518;
  undefined8 uStack_510;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  longlong local_4d8;
  longlong lStack_4d0;
  int32_t local_4c8;
  int32_t local_4c4;
  int32_t local_4c0;
  int32_t local_4bc;
  longlong local_4b8;
  longlong lStack_4b0;
  int32_t local_4a8;
  int32_t local_4a4;
  int32_t local_4a0;
  int32_t local_49c;
  longlong local_498;
  longlong lStack_490;
  int32_t local_488;
  int32_t local_484;
  int32_t local_480;
  int32_t local_47c;
  longlong local_478;
  longlong lStack_470;
  int32_t local_468;
  int32_t local_464;
  int32_t local_460;
  int32_t local_45c;
  longlong local_458;
  longlong lStack_450;
  int32_t local_448;
  int32_t local_444;
  int32_t local_440;
  int32_t local_43c;
  longlong local_438;
  longlong lStack_430;
  int32_t local_428;
  int32_t local_424;
  int32_t local_420;
  int32_t local_41c;
  longlong local_418;
  longlong lStack_410;
  int32_t local_408;
  int32_t local_404;
  int32_t local_400;
  int32_t local_3fc;
  longlong local_3f8;
  longlong lStack_3f0;
  int32_t local_3e8;
  int32_t local_3e4;
  int32_t local_3e0;
  int32_t local_3dc;
  longlong local_3d8;
  longlong lStack_3d0;
  int32_t local_3c8;
  int32_t local_3c4;
  int32_t local_3c0;
  int32_t local_3bc;
  longlong local_3b8;
  longlong lStack_3b0;
  int32_t local_3a8;
  int32_t local_3a4;
  int32_t local_3a0;
  int32_t local_39c;
  longlong local_398;
  longlong lStack_390;
  int32_t local_388;
  int32_t local_384;
  int32_t local_380;
  int32_t local_37c;
  longlong local_378;
  longlong lStack_370;
  int32_t local_368;
  int32_t local_364;
  int32_t local_360;
  int32_t local_35c;
  longlong local_358;
  longlong lStack_350;
  int32_t local_348;
  int32_t local_344;
  int32_t local_340;
  int32_t local_33c;
  longlong local_338;
  longlong lStack_330;
  int32_t local_328;
  int32_t local_324;
  int32_t local_320;
  int32_t local_31c;
  longlong local_318;
  longlong lStack_310;
  int32_t local_308;
  int32_t local_304;
  int32_t local_300;
  int32_t local_2fc;
  longlong local_2f8;
  longlong lStack_2f0;
  int32_t local_2e8;
  int32_t local_2e4;
  int32_t local_2e0;
  int32_t local_2dc;
  longlong local_2d8;
  longlong lStack_2d0;
  int32_t local_2c8;
  int32_t local_2c4;
  int32_t local_2c0;
  int32_t local_2bc;
  longlong local_2b8;
  longlong lStack_2b0;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  longlong local_298;
  longlong lStack_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  longlong local_278;
  longlong lStack_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  longlong local_258;
  longlong lStack_250;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  longlong local_238;
  longlong lStack_230;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  longlong local_218;
  longlong lStack_210;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  longlong local_1f8;
  longlong lStack_1f0;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  longlong local_1b8;
  longlong lStack_1b0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  longlong local_198;
  longlong lStack_190;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  longlong local_178;
  longlong lStack_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  longlong local_158;
  longlong lStack_150;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  longlong local_138;
  longlong lStack_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  longlong local_118;
  longlong lStack_110;
  int32_t local_108;
  int32_t local_104;
  int32_t local_100;
  int32_t local_fc;
  longlong local_f8;
  longlong lStack_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  longlong local_d8;
  longlong lStack_d0;
  int32_t local_c8;
  int32_t local_c4;
  int32_t local_c0;
  int32_t local_bc;
  longlong local_b8;
  longlong lStack_b0;
  int32_t local_a8;
  int32_t local_a4;
  int32_t local_a0;
  int32_t local_9c;
  longlong local_98;
  longlong lStack_90;
  int32_t local_88;
  int32_t local_84;
  int32_t local_80;
  int32_t local_7c;
  longlong local_78;
  longlong lStack_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  longlong local_58;
  longlong lStack_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  longlong local_38;
  longlong lStack_30;
  int32_t local_20;
  int32_t local_1c;
  int32_t local_18;
  int32_t local_14;
  
  local_5fc = in_R8D;
  local_5f8 = in_ECX;
  local_5f4 = in_EDX;
  local_5e8 = in_RDI;
  local_610 = cospi_arr(in_EDX);
  local_53c = 1 << ((char)local_5f4 - 1U & 0x1f);
  local_628 = CONCAT44(local_53c,local_53c);
  lStack_620 = CONCAT44(local_53c,local_53c);
  iVar1 = 8;
  if (local_5f8 != 0) {
    iVar1 = 6;
  }
  if (local_5fc + iVar1 < 0x10) {
    local_cdc = 0x10;
  }
  else {
    local_cdc = 8;
    if (local_5f8 != 0) {
      local_cdc = 6;
    }
    local_cdc = local_5fc + local_cdc;
  }
  local_62c = local_cdc;
  iVar1 = local_62c;
  local_62c._0_1_ = (char)local_cdc;
  local_540 = -(1 << ((char)local_62c - 1U & 0x1f));
  local_648 = CONCAT44(local_540,local_540);
  uStack_640 = CONCAT44(local_540,local_540);
  local_544 = (1 << ((char)local_62c - 1U & 0x1f)) + -1;
  local_658 = CONCAT44(local_544,local_544);
  uStack_650 = CONCAT44(local_544,local_544);
  local_548 = local_610[1];
  local_668 = CONCAT44(local_548,local_548);
  lStack_660 = CONCAT44(local_548,local_548);
  local_54c = local_610[2];
  local_678 = CONCAT44(local_54c,local_54c);
  lStack_670 = CONCAT44(local_54c,local_54c);
  local_550 = local_610[3];
  local_688 = CONCAT44(local_550,local_550);
  lStack_680 = CONCAT44(local_550,local_550);
  local_554 = local_610[4];
  local_698 = CONCAT44(local_554,local_554);
  lStack_690 = CONCAT44(local_554,local_554);
  local_558 = local_610[6];
  local_6a8 = CONCAT44(local_558,local_558);
  lStack_6a0 = CONCAT44(local_558,local_558);
  local_55c = local_610[8];
  local_6b8 = CONCAT44(local_55c,local_55c);
  lStack_6b0 = CONCAT44(local_55c,local_55c);
  local_560 = local_610[0xc];
  local_6c8 = CONCAT44(local_560,local_560);
  lStack_6c0 = CONCAT44(local_560,local_560);
  local_564 = local_610[0x10];
  local_6d8 = CONCAT44(local_564,local_564);
  lStack_6d0 = CONCAT44(local_564,local_564);
  local_568 = local_610[0x14];
  local_6e8 = CONCAT44(local_568,local_568);
  lStack_6e0 = CONCAT44(local_568,local_568);
  local_56c = local_610[0x18];
  local_6f8 = CONCAT44(local_56c,local_56c);
  lStack_6f0 = CONCAT44(local_56c,local_56c);
  local_570 = local_610[0x1c];
  local_708 = CONCAT44(local_570,local_570);
  lStack_700 = CONCAT44(local_570,local_570);
  local_574 = local_610[0x20];
  local_718 = CONCAT44(local_574,local_574);
  lStack_710 = CONCAT44(local_574,local_574);
  local_578 = local_610[0x28];
  local_728 = CONCAT44(local_578,local_578);
  lStack_720 = CONCAT44(local_578,local_578);
  local_57c = local_610[0x2c];
  local_738 = CONCAT44(local_57c,local_57c);
  lStack_730 = CONCAT44(local_57c,local_57c);
  local_580 = local_610[0x30];
  local_748 = CONCAT44(local_580,local_580);
  lStack_740 = CONCAT44(local_580,local_580);
  local_584 = local_610[0x38];
  local_758 = CONCAT44(local_584,local_584);
  lStack_750 = CONCAT44(local_584,local_584);
  local_588 = local_610[0x3c];
  local_768 = CONCAT44(local_588,local_588);
  lStack_760 = CONCAT44(local_588,local_588);
  local_58c = -local_610[4];
  local_778 = CONCAT44(local_58c,local_58c);
  lStack_770 = CONCAT44(local_58c,local_58c);
  local_590 = -local_610[8];
  local_788 = CONCAT44(local_590,local_590);
  lStack_780 = CONCAT44(local_590,local_590);
  local_594 = -local_610[0xc];
  local_798 = CONCAT44(local_594,local_594);
  lStack_790 = CONCAT44(local_594,local_594);
  local_598 = -local_610[0x10];
  local_7a8 = CONCAT44(local_598,local_598);
  lStack_7a0 = CONCAT44(local_598,local_598);
  local_59c = -local_610[0x14];
  local_7b8 = CONCAT44(local_59c,local_59c);
  lStack_7b0 = CONCAT44(local_59c,local_59c);
  local_5a0 = -local_610[0x18];
  local_7c8 = CONCAT44(local_5a0,local_5a0);
  lStack_7c0 = CONCAT44(local_5a0,local_5a0);
  local_5a4 = -local_610[0x1c];
  local_7d8 = CONCAT44(local_5a4,local_5a4);
  lStack_7d0 = CONCAT44(local_5a4,local_5a4);
  local_5a8 = -local_610[0x20];
  local_7e8 = CONCAT44(local_5a8,local_5a8);
  uStack_7e0 = CONCAT44(local_5a8,local_5a8);
  local_5ac = -local_610[0x24];
  local_7f8 = CONCAT44(local_5ac,local_5ac);
  lStack_7f0 = CONCAT44(local_5ac,local_5ac);
  local_5b0 = -local_610[0x28];
  local_808 = CONCAT44(local_5b0,local_5b0);
  lStack_800 = CONCAT44(local_5b0,local_5b0);
  local_5b4 = -local_610[0x30];
  local_818 = CONCAT44(local_5b4,local_5b4);
  lStack_810 = CONCAT44(local_5b4,local_5b4);
  local_5b8 = -local_610[0x34];
  local_828 = CONCAT44(local_5b8,local_5b8);
  lStack_820 = CONCAT44(local_5b8,local_5b8);
  local_5bc = -local_610[0x38];
  local_838 = CONCAT44(local_5bc,local_5bc);
  lStack_830 = CONCAT44(local_5bc,local_5bc);
  local_5c0 = local_610[0x3f];
  local_848 = CONCAT44(local_5c0,local_5c0);
  lStack_840 = CONCAT44(local_5c0,local_5c0);
  local_5c4 = -local_610[0x39];
  local_858 = CONCAT44(local_5c4,local_5c4);
  lStack_850 = CONCAT44(local_5c4,local_5c4);
  local_5c8 = local_610[7];
  local_868 = CONCAT44(local_5c8,local_5c8);
  lStack_860 = CONCAT44(local_5c8,local_5c8);
  local_5cc = local_610[5];
  local_878 = CONCAT44(local_5cc,local_5cc);
  lStack_870 = CONCAT44(local_5cc,local_5cc);
  local_5d0 = local_610[0x3b];
  local_888 = CONCAT44(local_5d0,local_5d0);
  lStack_880 = CONCAT44(local_5d0,local_5d0);
  local_5d4 = -local_610[0x3d];
  local_898 = CONCAT44(local_5d4,local_5d4);
  lStack_890 = CONCAT44(local_5d4,local_5d4);
  local_5d8 = -local_610[0x3a];
  local_8a8 = CONCAT44(local_5d8,local_5d8);
  lStack_8a0 = CONCAT44(local_5d8,local_5d8);
  local_5dc = local_610[0x3e];
  local_8b8 = CONCAT44(local_5dc,local_5dc);
  lStack_8b0 = CONCAT44(local_5dc,local_5dc);
  local_c38 = *(longlong *)(local_5e8 + 0x40);
  lStack_c30 = *(longlong *)(local_5e8 + 0x48);
  local_bb8 = *(longlong *)(local_5e8 + 0x20);
  lStack_bb0 = *(longlong *)(local_5e8 + 0x28);
  local_b38 = *(longlong *)(local_5e8 + 0x60);
  lStack_b30 = *(longlong *)(local_5e8 + 0x68);
  local_ab8 = *(longlong *)(local_5e8 + 0x10);
  lStack_ab0 = *(longlong *)(local_5e8 + 0x18);
  local_a38 = *(longlong *)(local_5e8 + 0x50);
  lStack_a30 = *(longlong *)(local_5e8 + 0x58);
  local_9b8 = *(longlong *)(local_5e8 + 0x30);
  lStack_9b0 = *(longlong *)(local_5e8 + 0x38);
  local_938 = *(longlong *)(local_5e8 + 0x70);
  lStack_930 = *(longlong *)(local_5e8 + 0x78);
  local_62c = iVar1;
  local_538 = local_628;
  lStack_530 = lStack_620;
  local_528 = local_53c;
  local_524 = local_53c;
  local_520 = local_53c;
  local_51c = local_53c;
  local_518 = local_648;
  uStack_510 = uStack_640;
  local_508 = local_540;
  local_504 = local_540;
  local_500 = local_540;
  local_4fc = local_540;
  local_4f8 = local_658;
  uStack_4f0 = uStack_650;
  local_4e8 = local_544;
  local_4e4 = local_544;
  local_4e0 = local_544;
  local_4dc = local_544;
  local_4d8 = local_668;
  lStack_4d0 = lStack_660;
  local_4c8 = local_548;
  local_4c4 = local_548;
  local_4c0 = local_548;
  local_4bc = local_548;
  local_4b8 = local_678;
  lStack_4b0 = lStack_670;
  local_4a8 = local_54c;
  local_4a4 = local_54c;
  local_4a0 = local_54c;
  local_49c = local_54c;
  local_498 = local_688;
  lStack_490 = lStack_680;
  local_488 = local_550;
  local_484 = local_550;
  local_480 = local_550;
  local_47c = local_550;
  local_478 = local_698;
  lStack_470 = lStack_690;
  local_468 = local_554;
  local_464 = local_554;
  local_460 = local_554;
  local_45c = local_554;
  local_458 = local_6a8;
  lStack_450 = lStack_6a0;
  local_448 = local_558;
  local_444 = local_558;
  local_440 = local_558;
  local_43c = local_558;
  local_438 = local_6b8;
  lStack_430 = lStack_6b0;
  local_428 = local_55c;
  local_424 = local_55c;
  local_420 = local_55c;
  local_41c = local_55c;
  local_418 = local_6c8;
  lStack_410 = lStack_6c0;
  local_408 = local_560;
  local_404 = local_560;
  local_400 = local_560;
  local_3fc = local_560;
  local_3f8 = local_6d8;
  lStack_3f0 = lStack_6d0;
  local_3e8 = local_564;
  local_3e4 = local_564;
  local_3e0 = local_564;
  local_3dc = local_564;
  local_3d8 = local_6e8;
  lStack_3d0 = lStack_6e0;
  local_3c8 = local_568;
  local_3c4 = local_568;
  local_3c0 = local_568;
  local_3bc = local_568;
  local_3b8 = local_6f8;
  lStack_3b0 = lStack_6f0;
  local_3a8 = local_56c;
  local_3a4 = local_56c;
  local_3a0 = local_56c;
  local_39c = local_56c;
  local_398 = local_708;
  lStack_390 = lStack_700;
  local_388 = local_570;
  local_384 = local_570;
  local_380 = local_570;
  local_37c = local_570;
  local_378 = local_718;
  lStack_370 = lStack_710;
  local_368 = local_574;
  local_364 = local_574;
  local_360 = local_574;
  local_35c = local_574;
  local_358 = local_728;
  lStack_350 = lStack_720;
  local_348 = local_578;
  local_344 = local_578;
  local_340 = local_578;
  local_33c = local_578;
  local_338 = local_738;
  lStack_330 = lStack_730;
  local_328 = local_57c;
  local_324 = local_57c;
  local_320 = local_57c;
  local_31c = local_57c;
  local_318 = local_748;
  lStack_310 = lStack_740;
  local_308 = local_580;
  local_304 = local_580;
  local_300 = local_580;
  local_2fc = local_580;
  local_2f8 = local_758;
  lStack_2f0 = lStack_750;
  local_2e8 = local_584;
  local_2e4 = local_584;
  local_2e0 = local_584;
  local_2dc = local_584;
  local_2d8 = local_768;
  lStack_2d0 = lStack_760;
  local_2c8 = local_588;
  local_2c4 = local_588;
  local_2c0 = local_588;
  local_2bc = local_588;
  local_2b8 = local_778;
  lStack_2b0 = lStack_770;
  local_2a8 = local_58c;
  local_2a4 = local_58c;
  local_2a0 = local_58c;
  local_29c = local_58c;
  local_298 = local_788;
  lStack_290 = lStack_780;
  local_288 = local_590;
  local_284 = local_590;
  local_280 = local_590;
  local_27c = local_590;
  local_278 = local_798;
  lStack_270 = lStack_790;
  local_268 = local_594;
  local_264 = local_594;
  local_260 = local_594;
  local_25c = local_594;
  local_258 = local_7a8;
  lStack_250 = lStack_7a0;
  local_248 = local_598;
  local_244 = local_598;
  local_240 = local_598;
  local_23c = local_598;
  local_238 = local_7b8;
  lStack_230 = lStack_7b0;
  local_228 = local_59c;
  local_224 = local_59c;
  local_220 = local_59c;
  local_21c = local_59c;
  local_218 = local_7c8;
  lStack_210 = lStack_7c0;
  local_208 = local_5a0;
  local_204 = local_5a0;
  local_200 = local_5a0;
  local_1fc = local_5a0;
  local_1f8 = local_7d8;
  lStack_1f0 = lStack_7d0;
  local_1e8 = local_5a4;
  local_1e4 = local_5a4;
  local_1e0 = local_5a4;
  local_1dc = local_5a4;
  local_1d8 = local_7e8;
  uStack_1d0 = uStack_7e0;
  local_1c8 = local_5a8;
  local_1c4 = local_5a8;
  local_1c0 = local_5a8;
  local_1bc = local_5a8;
  local_1b8 = local_7f8;
  lStack_1b0 = lStack_7f0;
  local_1a8 = local_5ac;
  local_1a4 = local_5ac;
  local_1a0 = local_5ac;
  local_19c = local_5ac;
  local_198 = local_808;
  lStack_190 = lStack_800;
  local_188 = local_5b0;
  local_184 = local_5b0;
  local_180 = local_5b0;
  local_17c = local_5b0;
  local_178 = local_818;
  lStack_170 = lStack_810;
  local_168 = local_5b4;
  local_164 = local_5b4;
  local_160 = local_5b4;
  local_15c = local_5b4;
  local_158 = local_828;
  lStack_150 = lStack_820;
  local_148 = local_5b8;
  local_144 = local_5b8;
  local_140 = local_5b8;
  local_13c = local_5b8;
  local_138 = local_838;
  lStack_130 = lStack_830;
  local_128 = local_5bc;
  local_124 = local_5bc;
  local_120 = local_5bc;
  local_11c = local_5bc;
  local_118 = local_848;
  lStack_110 = lStack_840;
  local_108 = local_5c0;
  local_104 = local_5c0;
  local_100 = local_5c0;
  local_fc = local_5c0;
  local_f8 = local_858;
  lStack_f0 = lStack_850;
  local_e8 = local_5c4;
  local_e4 = local_5c4;
  local_e0 = local_5c4;
  local_dc = local_5c4;
  local_d8 = local_868;
  lStack_d0 = lStack_860;
  local_c8 = local_5c8;
  local_c4 = local_5c8;
  local_c0 = local_5c8;
  local_bc = local_5c8;
  local_b8 = local_878;
  lStack_b0 = lStack_870;
  local_a8 = local_5cc;
  local_a4 = local_5cc;
  local_a0 = local_5cc;
  local_9c = local_5cc;
  local_98 = local_888;
  lStack_90 = lStack_880;
  local_88 = local_5d0;
  local_84 = local_5d0;
  local_80 = local_5d0;
  local_7c = local_5d0;
  local_78 = local_898;
  lStack_70 = lStack_890;
  local_68 = local_5d4;
  local_64 = local_5d4;
  local_60 = local_5d4;
  local_5c = local_5d4;
  local_58 = local_8a8;
  lStack_50 = lStack_8a0;
  local_48 = local_5d8;
  local_44 = local_5d8;
  local_40 = local_5d8;
  local_3c = local_5d8;
  local_38 = local_8b8;
  lStack_30 = lStack_8b0;
  local_20 = local_5dc;
  local_1c = local_5dc;
  local_18 = local_5dc;
  local_14 = local_5dc;
  half_btf_0_sse4_1((__m128i *)&local_668,(__m128i *)&local_ab8,(__m128i *)&local_628,local_5f4);
  local_8c8 = extraout_XMM0_Qa;
  lStack_8c0 = extraout_XMM0_Qb;
  half_btf_0_sse4_1((__m128i *)&local_848,(__m128i *)&local_ab8,(__m128i *)&local_628,local_5f4);
  local_ab8 = extraout_XMM0_Qa_00;
  lStack_ab0 = extraout_XMM0_Qb_00;
  half_btf_0_sse4_1((__m128i *)&local_858,(__m128i *)&local_938,(__m128i *)&local_628,local_5f4);
  local_a48 = extraout_XMM0_Qa_01;
  lStack_a40 = extraout_XMM0_Qb_01;
  half_btf_0_sse4_1((__m128i *)&local_868,(__m128i *)&local_938,(__m128i *)&local_628,local_5f4);
  local_938 = extraout_XMM0_Qa_02;
  lStack_930 = extraout_XMM0_Qb_02;
  half_btf_0_sse4_1((__m128i *)&local_878,(__m128i *)&local_a38,(__m128i *)&local_628,local_5f4);
  local_948 = extraout_XMM0_Qa_03;
  lStack_940 = extraout_XMM0_Qb_03;
  half_btf_0_sse4_1((__m128i *)&local_888,(__m128i *)&local_a38,(__m128i *)&local_628,local_5f4);
  local_a38 = extraout_XMM0_Qa_04;
  lStack_a30 = extraout_XMM0_Qb_04;
  half_btf_0_sse4_1((__m128i *)&local_898,(__m128i *)&local_9b8,(__m128i *)&local_628,local_5f4);
  local_9c8 = extraout_XMM0_Qa_05;
  lStack_9c0 = extraout_XMM0_Qb_05;
  half_btf_0_sse4_1((__m128i *)&local_688,(__m128i *)&local_9b8,(__m128i *)&local_628,local_5f4);
  local_9b8 = extraout_XMM0_Qa_06;
  lStack_9b0 = extraout_XMM0_Qb_06;
  half_btf_0_sse4_1((__m128i *)&local_678,(__m128i *)&local_bb8,(__m128i *)&local_628,local_5f4);
  local_ac8 = extraout_XMM0_Qa_07;
  lStack_ac0 = extraout_XMM0_Qb_07;
  half_btf_0_sse4_1((__m128i *)&local_8b8,(__m128i *)&local_bb8,(__m128i *)&local_628,local_5f4);
  local_bb8 = extraout_XMM0_Qa_08;
  lStack_bb0 = extraout_XMM0_Qb_08;
  half_btf_0_sse4_1((__m128i *)&local_8a8,(__m128i *)&local_b38,(__m128i *)&local_628,local_5f4);
  local_b48 = extraout_XMM0_Qa_09;
  lStack_b40 = extraout_XMM0_Qb_09;
  half_btf_0_sse4_1((__m128i *)&local_6a8,(__m128i *)&local_b38,(__m128i *)&local_628,local_5f4);
  local_aa8 = local_ab8;
  lStack_aa0 = lStack_ab0;
  local_a58 = local_a48;
  lStack_a50 = lStack_a40;
  local_a28 = local_a38;
  lStack_a20 = lStack_a30;
  local_9d8 = local_9c8;
  lStack_9d0 = lStack_9c0;
  local_9a8 = local_9b8;
  lStack_9a0 = lStack_9b0;
  local_958 = local_948;
  lStack_950 = lStack_940;
  local_928 = local_938;
  lStack_920 = lStack_930;
  local_8d8 = local_8c8;
  lStack_8d0 = lStack_8c0;
  local_b38 = extraout_XMM0_Qa_10;
  lStack_b30 = extraout_XMM0_Qb_10;
  half_btf_0_sse4_1((__m128i *)&local_698,(__m128i *)&local_c38,(__m128i *)&local_628,local_5f4);
  local_bc8 = extraout_XMM0_Qa_11;
  lStack_bc0 = extraout_XMM0_Qb_11;
  half_btf_0_sse4_1((__m128i *)&local_768,(__m128i *)&local_c38,(__m128i *)&local_628,local_5f4);
  local_ba8 = local_bb8;
  lStack_ba0 = lStack_bb0;
  local_b58 = local_b48;
  lStack_b50 = lStack_b40;
  local_b28 = local_b38;
  lStack_b20 = lStack_b30;
  local_ad8 = local_ac8;
  lStack_ad0 = lStack_ac0;
  local_c38 = extraout_XMM0_Qa_12;
  lStack_c30 = extraout_XMM0_Qb_12;
  half_btf_sse4_1((__m128i *)&local_778,(__m128i *)&local_aa8,(__m128i *)&local_768,
                  (__m128i *)&local_8d8,(__m128i *)&local_628,local_5f4);
  lVar3 = extraout_XMM0_Qa_13;
  lVar4 = extraout_XMM0_Qb_13;
  half_btf_sse4_1((__m128i *)&local_768,(__m128i *)&local_aa8,(__m128i *)&local_698,
                  (__m128i *)&local_8d8,(__m128i *)&local_628,local_5f4);
  local_aa8 = lVar3;
  lStack_aa0 = lVar4;
  local_8d8 = extraout_XMM0_Qa_14;
  lStack_8d0 = extraout_XMM0_Qb_14;
  half_btf_sse4_1((__m128i *)&local_7f8,(__m128i *)&local_a58,(__m128i *)&local_708,
                  (__m128i *)&local_928,(__m128i *)&local_628,local_5f4);
  lVar3 = extraout_XMM0_Qb_15;
  half_btf_sse4_1((__m128i *)&local_7d8,(__m128i *)&local_a58,(__m128i *)&local_7f8,
                  (__m128i *)&local_928,(__m128i *)&local_628,local_5f4);
  local_a58 = extraout_XMM0_Qa_16;
  lStack_a50 = extraout_XMM0_Qb_16;
  local_928 = extraout_XMM0_Qa_15;
  lStack_920 = lVar3;
  half_btf_sse4_1((__m128i *)&local_7b8,(__m128i *)&local_a28,(__m128i *)&local_738,
                  (__m128i *)&local_958,(__m128i *)&local_628,local_5f4);
  lVar3 = extraout_XMM0_Qa_17;
  lVar4 = extraout_XMM0_Qb_17;
  half_btf_sse4_1((__m128i *)&local_738,(__m128i *)&local_a28,(__m128i *)&local_6e8,
                  (__m128i *)&local_958,(__m128i *)&local_628,local_5f4);
  local_a28 = lVar3;
  lStack_a20 = lVar4;
  local_958 = extraout_XMM0_Qa_18;
  lStack_950 = extraout_XMM0_Qb_18;
  half_btf_sse4_1((__m128i *)&local_798,(__m128i *)&local_9d8,(__m128i *)&local_828,
                  (__m128i *)&local_9a8,(__m128i *)&local_628,local_5f4);
  lVar3 = extraout_XMM0_Qb_19;
  half_btf_sse4_1((__m128i *)&local_828,(__m128i *)&local_9d8,(__m128i *)&local_6c8,
                  (__m128i *)&local_9a8,(__m128i *)&local_628,local_5f4);
  local_c28 = local_c38;
  lStack_c20 = lStack_c30;
  local_bd8 = local_bc8;
  lStack_bd0 = lStack_bc0;
  local_9d8 = extraout_XMM0_Qa_19;
  lStack_9d0 = lVar3;
  local_9a8 = extraout_XMM0_Qa_20;
  lStack_9a0 = extraout_XMM0_Qb_20;
  half_btf_sse4_1((__m128i *)&local_788,(__m128i *)&local_ba8,(__m128i *)&local_758,
                  (__m128i *)&local_ad8,(__m128i *)&local_628,local_5f4);
  lVar3 = extraout_XMM0_Qa_21;
  lVar4 = extraout_XMM0_Qb_21;
  half_btf_sse4_1((__m128i *)&local_758,(__m128i *)&local_ba8,(__m128i *)&local_6b8,
                  (__m128i *)&local_ad8,(__m128i *)&local_628,local_5f4);
  local_ba8 = lVar3;
  lStack_ba0 = lVar4;
  local_ad8 = extraout_XMM0_Qa_22;
  lStack_ad0 = extraout_XMM0_Qb_22;
  half_btf_sse4_1((__m128i *)&local_7c8,(__m128i *)&local_b58,(__m128i *)&local_808,
                  (__m128i *)&local_b28,(__m128i *)&local_628,local_5f4);
  lVar3 = extraout_XMM0_Qb_23;
  half_btf_sse4_1((__m128i *)&local_808,(__m128i *)&local_b58,(__m128i *)&local_6f8,
                  (__m128i *)&local_b28,(__m128i *)&local_628,local_5f4);
  local_a88 = local_ab8;
  lStack_a80 = lStack_ab0;
  local_a98 = local_aa8;
  lStack_a90 = lStack_aa0;
  local_a78 = local_a48;
  lStack_a70 = lStack_a40;
  local_a68 = local_a58;
  lStack_a60 = lStack_a50;
  local_a08 = local_a38;
  lStack_a00 = lStack_a30;
  local_a18 = local_a28;
  lStack_a10 = lStack_a20;
  local_9f8 = local_9c8;
  lStack_9f0 = lStack_9c0;
  local_9e8 = local_9d8;
  lStack_9e0 = lStack_9d0;
  local_988 = local_9b8;
  lStack_980 = lStack_9b0;
  local_998 = local_9a8;
  lStack_990 = lStack_9a0;
  local_978 = local_948;
  lStack_970 = lStack_940;
  local_968 = local_958;
  lStack_960 = lStack_950;
  local_908 = local_938;
  lStack_900 = lStack_930;
  local_918 = local_928;
  lStack_910 = lStack_920;
  local_8f8 = local_8c8;
  lStack_8f0 = lStack_8c0;
  local_8e8 = local_8d8;
  lStack_8e0 = lStack_8d0;
  local_b58 = extraout_XMM0_Qa_23;
  lStack_b50 = lVar3;
  local_b28 = extraout_XMM0_Qa_24;
  lStack_b20 = extraout_XMM0_Qb_24;
  half_btf_0_sse4_1((__m128i *)&local_718,(__m128i *)&stack0xfffffffffffff348,(__m128i *)&local_628,
                    local_5f4);
  cospim16_00 = extraout_XMM0_Qa_25;
  cospi32_00 = extraout_XMM0_Qb_25;
  half_btf_0_sse4_1((__m128i *)&local_718,(__m128i *)&stack0xfffffffffffff348,(__m128i *)&local_628,
                    local_5f4);
  cospim32_00 = extraout_XMM0_Qa_26;
  u_00 = extraout_XMM0_Qb_26;
  half_btf_sse4_1((__m128i *)&local_7a8,(__m128i *)&local_c28,(__m128i *)&local_748,
                  (__m128i *)&local_bd8,(__m128i *)&local_628,local_5f4);
  lVar3 = extraout_XMM0_Qb_27;
  half_btf_sse4_1((__m128i *)&local_748,(__m128i *)&local_c28,(__m128i *)&local_6d8,
                  (__m128i *)&local_bd8,(__m128i *)&local_628,local_5f4);
  local_b88 = local_bb8;
  lStack_b80 = lStack_bb0;
  local_b98 = local_ba8;
  lStack_b90 = lStack_ba0;
  local_b78 = local_b48;
  lStack_b70 = lStack_b40;
  local_b68 = local_b58;
  lStack_b60 = lStack_b50;
  local_b08 = local_b38;
  lStack_b00 = lStack_b30;
  local_b18 = local_b28;
  lStack_b10 = lStack_b20;
  local_af8 = local_ac8;
  lStack_af0 = lStack_ac0;
  local_ae8 = local_ad8;
  lStack_ae0 = lStack_ad0;
  local_c28 = extraout_XMM0_Qa_27;
  lStack_c20 = lVar3;
  local_bd8 = extraout_XMM0_Qa_28;
  lStack_bd0 = extraout_XMM0_Qb_28;
  half_btf_sse4_1((__m128i *)&local_788,(__m128i *)&local_a98,(__m128i *)&local_758,
                  (__m128i *)&local_8e8,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_758,(__m128i *)&local_a98,(__m128i *)&local_6b8,
                  (__m128i *)&local_8e8,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_788,(__m128i *)&local_a88,(__m128i *)&local_758,
                  (__m128i *)&local_8f8,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_758,(__m128i *)&local_a88,(__m128i *)&local_6b8,
                  (__m128i *)&local_8f8,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_838,(__m128i *)&local_a78,(__m128i *)&local_788,
                  (__m128i *)&local_908,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_788,(__m128i *)&local_a78,(__m128i *)&local_758,
                  (__m128i *)&local_908,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_838,(__m128i *)&local_a68,(__m128i *)&local_788,
                  (__m128i *)&local_918,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_788,(__m128i *)&local_a68,(__m128i *)&local_758,
                  (__m128i *)&local_918,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_808,(__m128i *)&local_a18,(__m128i *)&local_6f8,
                  (__m128i *)&local_968,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_6f8,(__m128i *)&local_a18,(__m128i *)&local_728,
                  (__m128i *)&local_968,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_808,(__m128i *)&local_a08,(__m128i *)&local_6f8,
                  (__m128i *)&local_978,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_6f8,(__m128i *)&local_a08,(__m128i *)&local_728,
                  (__m128i *)&local_978,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_7c8,(__m128i *)&local_9f8,(__m128i *)&local_808,
                  (__m128i *)&local_988,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_808,(__m128i *)&local_9f8,(__m128i *)&local_6f8,
                  (__m128i *)&local_988,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_7c8,(__m128i *)&local_9e8,(__m128i *)&local_808,
                  (__m128i *)&local_998,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_808,(__m128i *)&local_9e8,(__m128i *)&local_6f8,
                  (__m128i *)&local_998,(__m128i *)&local_628,local_5f4);
  local_c08 = local_c38;
  lStack_c00 = lStack_c30;
  local_c18 = local_c28;
  lStack_c10 = lStack_c20;
  local_bf8 = local_bc8;
  lStack_bf0 = lStack_bc0;
  local_be8 = local_bd8;
  lStack_be0 = lStack_bd0;
  cospim32_01 = cospim32_00;
  cospim48_00 = u_00;
  clamp_lo_01 = cospim16_00;
  clamp_hi_00 = cospi32_00;
  half_btf_sse4_1((__m128i *)&local_7a8,(__m128i *)&local_b98,(__m128i *)&local_748,
                  (__m128i *)&local_ae8,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_748,(__m128i *)&local_b98,(__m128i *)&local_6d8,
                  (__m128i *)&local_ae8,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_7a8,(__m128i *)&local_b88,(__m128i *)&local_748,
                  (__m128i *)&local_af8,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_748,(__m128i *)&local_b88,(__m128i *)&local_6d8,
                  (__m128i *)&local_af8,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_818,(__m128i *)&local_b78,(__m128i *)&local_7a8,
                  (__m128i *)&local_b08,(__m128i *)&local_628,local_5f4);
  cospi16_00 = extraout_XMM0_Qa_29;
  cospi48_00 = extraout_XMM0_Qb_29;
  half_btf_sse4_1((__m128i *)&local_7a8,(__m128i *)&local_b78,(__m128i *)&local_748,
                  (__m128i *)&local_b08,(__m128i *)&local_628,local_5f4);
  half_btf_sse4_1((__m128i *)&local_818,(__m128i *)&local_b68,(__m128i *)&local_7a8,
                  (__m128i *)&local_b18,(__m128i *)&local_628,local_5f4);
  out1 = (__m128i *)(ulong)local_5f4;
  palVar2 = (__m128i *)&local_628;
  clamp_lo_00 = extraout_XMM0_Qb_30;
  half_btf_sse4_1((__m128i *)&local_7a8,(__m128i *)&local_b68,(__m128i *)&local_748,
                  (__m128i *)&local_b18,palVar2,local_5f4);
  for (local_604 = 0x20; (int)local_604 < 0x40; local_604 = local_604 + 0x10) {
    for (local_608 = local_604; (int)local_608 < (int)(local_604 + 4); local_608 = local_608 + 1) {
      in0[0] = &stack0xfffffffffffff348 + (long)(int)local_608 * 0x10;
      in0[1] = &stack0xfffffffffffff348 + (long)(int)(local_608 ^ 7) * 0x10;
      in1[1] = (longlong)&local_658;
      in1[0] = (longlong)&local_648;
      addsub_sse4_1(in0,in1,palVar2,out1,in_stack_fffffffffffff2f8,in_stack_fffffffffffff300);
      in0_00[0] = &stack0xfffffffffffff348 + (long)(int)(local_608 ^ 0xf) * 0x10;
      in0_00[1] = &stack0xfffffffffffff348 + (long)(int)(local_608 ^ 8) * 0x10;
      in1_00[1] = (longlong)&local_658;
      in1_00[0] = (longlong)&local_648;
      addsub_sse4_1(in0_00,in1_00,palVar2,out1,in_stack_fffffffffffff2f8,in_stack_fffffffffffff300);
    }
  }
  palVar2 = u_00;
  idct64_stage8_sse4_1
            (u_00,cospim32_00,cospi32_00,cospim16_00,cospi48_00,cospi16_00,cospim48_00,clamp_lo_01,
             clamp_hi_00,clamp_lo_01,(int)clamp_hi_00);
  bit_00 = (int)clamp_hi_00;
  idct64_stage9_sse4_1
            (u_00,cospim32_00,cospi32_00,cospim16_00,cospi48_00,cospi16_00,(int)cospim48_00);
  iVar1 = (int)((ulong)cospi16_00 >> 0x20);
  idct64_stage10_sse4_1(cospim48_00,cospim32_01,u_00,cospim32_00,cospi32_00,cospim16_00,bit_00);
  idct64_stage11_sse4_1
            (cospi32_00,cospim16_00,(int)((ulong)cospi48_00 >> 0x20),(int)cospi48_00,iVar1,
             clamp_lo_00,palVar2);
  return;
}

Assistant:

static void idct64x64_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  int i, j;
  const int32_t *cospi = cospi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);

  const __m128i cospi1 = _mm_set1_epi32(cospi[1]);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi3 = _mm_set1_epi32(cospi[3]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospim12 = _mm_set1_epi32(-cospi[12]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospim28 = _mm_set1_epi32(-cospi[28]);
  const __m128i cospim32 = _mm_set1_epi32(-cospi[32]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospi63 = _mm_set1_epi32(cospi[63]);
  const __m128i cospim57 = _mm_set1_epi32(-cospi[57]);
  const __m128i cospi7 = _mm_set1_epi32(cospi[7]);
  const __m128i cospi5 = _mm_set1_epi32(cospi[5]);
  const __m128i cospi59 = _mm_set1_epi32(cospi[59]);
  const __m128i cospim61 = _mm_set1_epi32(-cospi[61]);
  const __m128i cospim58 = _mm_set1_epi32(-cospi[58]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);

  {
    __m128i u[64];

    // stage 1
    u[0] = in[0];
    u[8] = in[4];
    u[16] = in[2];
    u[24] = in[6];
    u[32] = in[1];
    u[40] = in[5];
    u[48] = in[3];
    u[56] = in[7];

    // stage 2
    u[63] = half_btf_0_sse4_1(&cospi1, &u[32], &rnding, bit);
    u[32] = half_btf_0_sse4_1(&cospi63, &u[32], &rnding, bit);
    u[39] = half_btf_0_sse4_1(&cospim57, &u[56], &rnding, bit);
    u[56] = half_btf_0_sse4_1(&cospi7, &u[56], &rnding, bit);
    u[55] = half_btf_0_sse4_1(&cospi5, &u[40], &rnding, bit);
    u[40] = half_btf_0_sse4_1(&cospi59, &u[40], &rnding, bit);
    u[47] = half_btf_0_sse4_1(&cospim61, &u[48], &rnding, bit);
    u[48] = half_btf_0_sse4_1(&cospi3, &u[48], &rnding, bit);

    // stage 3
    u[31] = half_btf_0_sse4_1(&cospi2, &u[16], &rnding, bit);
    u[16] = half_btf_0_sse4_1(&cospi62, &u[16], &rnding, bit);
    u[23] = half_btf_0_sse4_1(&cospim58, &u[24], &rnding, bit);
    u[24] = half_btf_0_sse4_1(&cospi6, &u[24], &rnding, bit);
    u[33] = u[32];
    u[38] = u[39];
    u[41] = u[40];
    u[46] = u[47];
    u[49] = u[48];
    u[54] = u[55];
    u[57] = u[56];
    u[62] = u[63];

    // stage 4
    __m128i temp1, temp2;
    u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);
    u[17] = u[16];
    u[22] = u[23];
    u[25] = u[24];
    u[30] = u[31];

    temp1 = half_btf_sse4_1(&cospim4, &u[33], &cospi60, &u[62], &rnding, bit);
    u[62] = half_btf_sse4_1(&cospi60, &u[33], &cospi4, &u[62], &rnding, bit);
    u[33] = temp1;

    temp2 = half_btf_sse4_1(&cospim36, &u[38], &cospi28, &u[57], &rnding, bit);
    u[38] = half_btf_sse4_1(&cospim28, &u[38], &cospim36, &u[57], &rnding, bit);
    u[57] = temp2;

    temp1 = half_btf_sse4_1(&cospim20, &u[41], &cospi44, &u[54], &rnding, bit);
    u[54] = half_btf_sse4_1(&cospi44, &u[41], &cospi20, &u[54], &rnding, bit);
    u[41] = temp1;

    temp2 = half_btf_sse4_1(&cospim12, &u[46], &cospim52, &u[49], &rnding, bit);
    u[49] = half_btf_sse4_1(&cospim52, &u[46], &cospi12, &u[49], &rnding, bit);
    u[46] = temp2;

    // stage 5
    u[9] = u[8];
    u[14] = u[15];

    temp1 = half_btf_sse4_1(&cospim8, &u[17], &cospi56, &u[30], &rnding, bit);
    u[30] = half_btf_sse4_1(&cospi56, &u[17], &cospi8, &u[30], &rnding, bit);
    u[17] = temp1;

    temp2 = half_btf_sse4_1(&cospim24, &u[22], &cospim40, &u[25], &rnding, bit);
    u[25] = half_btf_sse4_1(&cospim40, &u[22], &cospi24, &u[25], &rnding, bit);
    u[22] = temp2;

    u[35] = u[32];
    u[34] = u[33];
    u[36] = u[39];
    u[37] = u[38];
    u[43] = u[40];
    u[42] = u[41];
    u[44] = u[47];
    u[45] = u[46];
    u[51] = u[48];
    u[50] = u[49];
    u[52] = u[55];
    u[53] = u[54];
    u[59] = u[56];
    u[58] = u[57];
    u[60] = u[63];
    u[61] = u[62];

    // stage 6
    temp1 = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[1] = half_btf_0_sse4_1(&cospi32, &u[0], &rnding, bit);
    u[0] = temp1;

    temp2 = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = temp2;
    u[19] = u[16];
    u[18] = u[17];
    u[20] = u[23];
    u[21] = u[22];
    u[27] = u[24];
    u[26] = u[25];
    u[28] = u[31];
    u[29] = u[30];

    temp1 = half_btf_sse4_1(&cospim8, &u[34], &cospi56, &u[61], &rnding, bit);
    u[61] = half_btf_sse4_1(&cospi56, &u[34], &cospi8, &u[61], &rnding, bit);
    u[34] = temp1;
    temp2 = half_btf_sse4_1(&cospim8, &u[35], &cospi56, &u[60], &rnding, bit);
    u[60] = half_btf_sse4_1(&cospi56, &u[35], &cospi8, &u[60], &rnding, bit);
    u[35] = temp2;
    temp1 = half_btf_sse4_1(&cospim56, &u[36], &cospim8, &u[59], &rnding, bit);
    u[59] = half_btf_sse4_1(&cospim8, &u[36], &cospi56, &u[59], &rnding, bit);
    u[36] = temp1;
    temp2 = half_btf_sse4_1(&cospim56, &u[37], &cospim8, &u[58], &rnding, bit);
    u[58] = half_btf_sse4_1(&cospim8, &u[37], &cospi56, &u[58], &rnding, bit);
    u[37] = temp2;
    temp1 = half_btf_sse4_1(&cospim40, &u[42], &cospi24, &u[53], &rnding, bit);
    u[53] = half_btf_sse4_1(&cospi24, &u[42], &cospi40, &u[53], &rnding, bit);
    u[42] = temp1;
    temp2 = half_btf_sse4_1(&cospim40, &u[43], &cospi24, &u[52], &rnding, bit);
    u[52] = half_btf_sse4_1(&cospi24, &u[43], &cospi40, &u[52], &rnding, bit);
    u[43] = temp2;
    temp1 = half_btf_sse4_1(&cospim24, &u[44], &cospim40, &u[51], &rnding, bit);
    u[51] = half_btf_sse4_1(&cospim40, &u[44], &cospi24, &u[51], &rnding, bit);
    u[44] = temp1;
    temp2 = half_btf_sse4_1(&cospim24, &u[45], &cospim40, &u[50], &rnding, bit);
    u[50] = half_btf_sse4_1(&cospim40, &u[45], &cospi24, &u[50], &rnding, bit);
    u[45] = temp2;

    // stage 7
    u[3] = u[0];
    u[2] = u[1];
    u[11] = u[8];
    u[10] = u[9];
    u[12] = u[15];
    u[13] = u[14];

    temp1 = half_btf_sse4_1(&cospim16, &u[18], &cospi48, &u[29], &rnding, bit);
    u[29] = half_btf_sse4_1(&cospi48, &u[18], &cospi16, &u[29], &rnding, bit);
    u[18] = temp1;
    temp2 = half_btf_sse4_1(&cospim16, &u[19], &cospi48, &u[28], &rnding, bit);
    u[28] = half_btf_sse4_1(&cospi48, &u[19], &cospi16, &u[28], &rnding, bit);
    u[19] = temp2;
    temp1 = half_btf_sse4_1(&cospim48, &u[20], &cospim16, &u[27], &rnding, bit);
    u[27] = half_btf_sse4_1(&cospim16, &u[20], &cospi48, &u[27], &rnding, bit);
    u[20] = temp1;
    temp2 = half_btf_sse4_1(&cospim48, &u[21], &cospim16, &u[26], &rnding, bit);
    u[26] = half_btf_sse4_1(&cospim16, &u[21], &cospi48, &u[26], &rnding, bit);
    u[21] = temp2;
    for (i = 32; i < 64; i += 16) {
      for (j = i; j < i + 4; j++) {
        addsub_sse4_1(u[j], u[j ^ 7], &u[j], &u[j ^ 7], &clamp_lo, &clamp_hi);
        addsub_sse4_1(u[j ^ 15], u[j ^ 8], &u[j ^ 15], &u[j ^ 8], &clamp_lo,
                      &clamp_hi);
      }
    }

    // stage 8
    u[7] = u[0];
    u[6] = u[1];
    u[5] = u[2];
    u[4] = u[3];

    idct64_stage8_sse4_1(u, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                         &cospim48, &clamp_lo, &clamp_hi, &rnding, bit);

    // stage 9
    idct64_stage9_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                         bit);

    // stage 10
    idct64_stage10_sse4_1(u, &cospim32, &cospi32, &clamp_lo, &clamp_hi, &rnding,
                          bit);

    // stage 11
    idct64_stage11_sse4_1(u, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}